

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::DockNodePreviewDockSetup
               (ImGuiWindow *host_window,ImGuiDockNode *host_node,ImGuiWindow *root_payload,
               ImGuiDockPreviewData *data,bool is_explicit_target,bool is_outer_docking)

{
  float *pfVar1;
  ImVec2 IVar2;
  int iVar3;
  int iVar4;
  ImGuiDockNode *pIVar5;
  bool bVar6;
  ImGuiContext *pIVar7;
  ImGuiDockNode *pIVar8;
  ulong uVar9;
  ushort uVar10;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  ImGuiDockNode *pIVar14;
  ushort uVar15;
  uint uVar16;
  ImVec2 *pIVar17;
  long lVar18;
  ImVec2 *pIVar19;
  bool bVar20;
  uint uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  ImVec2 pos_old;
  ImVec2 size_old;
  ImVec2 local_48;
  ImVec2 local_40;
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  
  pIVar7 = GImGui;
  pIVar5 = root_payload->DockNodeAsHost;
  if (host_node == (ImGuiDockNode *)0x0) {
    pIVar14 = (ImGuiDockNode *)0x0;
  }
  else {
    uVar16 = *(uint *)&host_node->field_0xb8;
    pIVar14 = host_node;
    pIVar8 = host_node;
    if ((uVar16 >> 9 & 1) == 0) {
      do {
        pIVar14 = pIVar8;
        pIVar8 = pIVar14->ParentNode;
      } while (pIVar14->ParentNode != (ImGuiDockNode *)0x0);
      uVar16 = (uint)*(ushort *)&pIVar14->field_0xb8;
    }
    if ((uVar16 >> 9 & 1) == 0) {
      __assert_fail("ref_node_for_rect->IsVisible",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/SocketByte[P]dear-imgui-template/lib/imgui/src/imgui.cpp"
                    ,0x3583,
                    "void ImGui::DockNodePreviewDockSetup(ImGuiWindow *, ImGuiDockNode *, ImGuiWindow *, ImGuiDockPreviewData *, bool, bool)"
                   );
    }
  }
  if (pIVar5 == (ImGuiDockNode *)0x0) {
    uVar16 = (root_payload->WindowClass).DockNodeFlagsOverrideSet;
  }
  else {
    uVar16 = pIVar5->LocalFlags | pIVar5->SharedFlags;
  }
  if (host_node == (ImGuiDockNode *)0x0) {
    uVar11 = (host_window->WindowClass).DockNodeFlagsOverrideSet;
  }
  else {
    uVar11 = host_node->LocalFlags | host_node->SharedFlags;
  }
  data->IsCenterAvailable = true;
  if ((is_outer_docking) || ((uVar11 & 0x10000) != 0)) {
LAB_0013c82c:
    data->IsCenterAvailable = false;
  }
  else {
    if ((host_node == (ImGuiDockNode *)0x0) || ((uVar11 & 4) == 0)) {
      if (host_node != (ImGuiDockNode *)0x0) goto LAB_0013c7e2;
      if (pIVar5 != (ImGuiDockNode *)0x0) goto LAB_0013c804;
    }
    else {
      if ((host_node->LocalFlags & 0x800) != 0) goto LAB_0013c82c;
LAB_0013c7e2:
      if ((pIVar5 != (ImGuiDockNode *)0x0) &&
         (host_node->ChildNodes[0] != (ImGuiDockNode *)0x0 || (host_node->Windows).Size != 0)) {
LAB_0013c804:
        if ((pIVar5->ChildNodes[0] != (ImGuiDockNode *)0x0) &&
           (pIVar5->OnlyNodeWithWindows == (ImGuiDockNode *)0x0)) goto LAB_0013c82c;
      }
    }
    if ((uVar16 & 0x100000) != 0 || (uVar11 & 0x80000) != 0) goto LAB_0013c82c;
  }
  data->IsSidesAvailable = true;
  if (((uVar11 & 0x10) == 0) && ((pIVar7->IO).ConfigDockingNoSplit == false)) {
    if ((host_node == (ImGuiDockNode *)0x0 || is_outer_docking) ||
       ((host_node->ParentNode != (ImGuiDockNode *)0x0 || ((host_node->LocalFlags & 0x800) == 0))))
    {
      if ((uVar16 & 0x40000) != 0 || (uVar11 & 0x20000) != 0) goto LAB_0013c877;
      goto LAB_0013c87e;
    }
    data->IsSidesAvailable = false;
LAB_0013c883:
    if ((host_node->field_0xb9 & 8) == 0) {
      iVar3._0_1_ = root_payload->HasCloseButton;
      iVar3._1_1_ = root_payload->ResizeBorderHeld;
      iVar3._2_2_ = root_payload->BeginCount;
      uVar15 = (ushort)*(undefined4 *)&(data->FutureNode).field_0xb8 & 0xf7ff |
               (ushort)(iVar3 << 0xb);
    }
    else {
      uVar15 = (ushort)*(undefined4 *)&(data->FutureNode).field_0xb8 | 0x800;
    }
    *(ushort *)&(data->FutureNode).field_0xb8 = uVar15;
    uVar10 = 0x1000;
  }
  else {
LAB_0013c877:
    data->IsSidesAvailable = false;
LAB_0013c87e:
    if (host_node != (ImGuiDockNode *)0x0) goto LAB_0013c883;
    if (host_window->HasCloseButton == false) {
      iVar4._0_1_ = root_payload->HasCloseButton;
      iVar4._1_1_ = root_payload->ResizeBorderHeld;
      iVar4._2_2_ = root_payload->BeginCount;
      uVar15 = (ushort)*(undefined4 *)&(data->FutureNode).field_0xb8 & 0xf7ff |
               (ushort)(iVar4 << 0xb);
    }
    else {
      uVar15 = (ushort)*(undefined4 *)&(data->FutureNode).field_0xb8 | 0x800;
    }
    *(ushort *)&(data->FutureNode).field_0xb8 = uVar15;
    uVar10 = (ushort)((~host_window->Flags & 0x20U) << 7);
  }
  pIVar17 = &pIVar14->Pos;
  if (host_node == (ImGuiDockNode *)0x0) {
    pIVar17 = &host_window->Pos;
  }
  *(ushort *)&(data->FutureNode).field_0xb8 = uVar10 | uVar15 & 0xefff;
  pIVar19 = &host_window->Size;
  if (host_node != (ImGuiDockNode *)0x0) {
    pIVar19 = &pIVar14->Size;
  }
  (data->FutureNode).Pos = *pIVar17;
  (data->FutureNode).Size = *pIVar19;
  data->SplitNode = host_node;
  data->SplitDir = -1;
  data->IsSplitDirExplicit = false;
  if (host_window->Collapsed == false) {
    uVar11 = 0xffffffff;
    lVar18 = 0;
    bVar20 = false;
    uVar16 = 0xffffffff;
    do {
      if (lVar18 == 0) {
        if (data->IsCenterAvailable != false) goto LAB_0013c9e3;
        goto LAB_0013cbd6;
      }
      if (data->IsSidesAvailable != true) goto LAB_0013cbd6;
LAB_0013c9e3:
      IVar2 = (data->FutureNode).Pos;
      fVar25 = IVar2.x;
      fVar28 = IVar2.y;
      IVar2 = (data->FutureNode).Size;
      fVar29 = IVar2.x + fVar25;
      fVar30 = IVar2.y + fVar28;
      fVar23 = fVar29 - fVar25;
      fVar24 = fVar30 - fVar28;
      fVar22 = fVar23;
      if (fVar24 <= fVar23) {
        fVar22 = fVar24;
      }
      fVar27 = pIVar7->FontSize * 1.5;
      fVar26 = pIVar7->FontSize * 0.5;
      uVar21 = -(uint)(fVar22 * 0.125 <= fVar26);
      fVar22 = (float)(uVar21 & (uint)fVar26 | ~uVar21 & (uint)(fVar22 * 0.125));
      if (fVar22 <= fVar27) {
        fVar27 = fVar22;
      }
      if (is_outer_docking) {
        fVar26 = (float)(int)(fVar27 * 1.5);
        fVar22 = (float)(int)(fVar27 * 0.8);
        fVar27 = (float)(int)(fVar23 * 0.5 - fVar22);
        fVar23 = (float)(int)(fVar24 * 0.5 - fVar22);
      }
      else {
        fVar26 = (float)(int)fVar27;
        fVar22 = (float)(int)(fVar27 * 0.9);
        fVar27 = (float)(int)(fVar26 * 2.4);
        fVar23 = fVar27;
      }
      fVar24 = (float)(int)((fVar25 + fVar29) * 0.5);
      fVar25 = (float)(int)((fVar28 + fVar30) * 0.5);
      if (lVar18 == 0) {
        fVar28 = fVar25 + fVar26;
        fVar23 = fVar25 - fVar26;
        goto LAB_0013cb70;
      }
      switch(uVar11) {
      case 0:
        fVar29 = (fVar24 - fVar27) + fVar22;
        fVar28 = fVar25 + fVar26;
        fVar22 = (fVar24 - fVar27) - fVar22;
        fVar23 = fVar25 - fVar26;
        break;
      case 1:
        fVar29 = fVar27 + fVar24 + fVar22;
        fVar28 = fVar25 + fVar26;
        fVar22 = (fVar27 + fVar24) - fVar22;
        fVar23 = fVar25 - fVar26;
        break;
      case 2:
        fVar23 = fVar25 - fVar23;
        goto LAB_0013cb5f;
      case 3:
        fVar23 = fVar23 + fVar25;
LAB_0013cb5f:
        fVar28 = fVar23 + fVar22;
        fVar23 = fVar23 - fVar22;
LAB_0013cb70:
        fVar29 = fVar24 + fVar26;
        fVar22 = fVar24 - fVar26;
        break;
      default:
        pfVar1 = (float *)((long)&data->DropRectsDraw[0].Min.x + lVar18);
        fVar22 = *pfVar1;
        fVar23 = pfVar1[1];
        fVar29 = pfVar1[2];
        fVar28 = pfVar1[3];
        goto LAB_0013cb7e;
      }
      pfVar1 = (float *)((long)&data->DropRectsDraw[0].Min.x + lVar18);
      *pfVar1 = fVar22;
      pfVar1[1] = fVar23;
      pfVar1[2] = fVar29;
      pfVar1[3] = fVar28;
LAB_0013cb7e:
      fVar30 = (pIVar7->IO).MousePos.x;
      if (is_outer_docking) {
LAB_0013cb8b:
        if ((((fVar22 <= fVar30) && (fVar22 = (pIVar7->IO).MousePos.y, fVar23 <= fVar22)) &&
            (fVar30 < fVar29)) && (fVar22 < fVar28)) {
LAB_0013cbc2:
          data->SplitDir = uVar11;
          data->IsSplitDirExplicit = true;
          bVar20 = true;
          uVar16 = uVar11;
        }
      }
      else {
        fVar24 = fVar30 - fVar24;
        fVar25 = (pIVar7->IO).MousePos.y - fVar25;
        fVar27 = fVar24 * fVar24 + fVar25 * fVar25;
        if (fVar26 * 1.4 * fVar26 * 1.4 <= fVar27) {
          if (fVar26 * 2.6 * fVar26 * 2.6 <= fVar27) {
            fVar24 = (float)(int)(fVar26 * 0.3);
            fVar29 = fVar29 + fVar24;
            fVar28 = fVar28 + fVar24;
            fVar22 = fVar22 - fVar24;
            fVar23 = fVar23 - fVar24;
            goto LAB_0013cb8b;
          }
          uVar21 = (uint)(0.0 < fVar24);
          if (ABS(fVar24) <= ABS(fVar25)) {
            uVar21 = 0.0 < fVar25 | 2;
          }
          if (uVar11 == uVar21) goto LAB_0013cbc2;
        }
        else if (lVar18 == 0) goto LAB_0013cbc2;
      }
LAB_0013cbd6:
      lVar18 = lVar18 + 0x10;
      uVar11 = uVar11 + 1;
    } while (lVar18 != 0x50);
    if (uVar16 == 0xffffffff) goto LAB_0013cd09;
    bVar13 = true;
    bVar6 = false;
  }
  else {
    bVar20 = false;
LAB_0013cd09:
    bVar13 = data->IsCenterAvailable;
    uVar16 = 0xffffffff;
    bVar6 = true;
  }
  data->IsDropAllowed = bVar13;
  if ((!is_explicit_target && !bVar20) && ((pIVar7->IO).ConfigDockingWithShift == false)) {
    data->IsDropAllowed = false;
  }
  data->SplitRatio = 0.0;
  if (bVar6) {
    return;
  }
  bVar20 = uVar16 < 2;
  uVar12 = (ulong)!bVar20;
  local_38.x = 0.0;
  local_38.y = 0.0;
  local_40 = (data->FutureNode).Pos;
  local_48.x = 0.0;
  local_48.y = 0.0;
  local_30 = (data->FutureNode).Size;
  local_28 = root_payload->Size;
  fVar23 = (pIVar7->Style).ItemInnerSpacing.x;
  (&local_38.x)[bVar20] = (&local_40.x)[bVar20];
  (&local_48.x)[bVar20] = (&local_30.x)[bVar20];
  uVar9 = (ulong)((uint)!bVar20 * 4);
  fVar24 = *(float *)((long)&local_30.x + uVar9) - fVar23;
  fVar22 = *(float *)((long)&local_28.x + uVar9);
  fVar25 = fVar24 * 0.5;
  if (fVar22 <= 0.0 || fVar25 < fVar22) {
    fVar22 = (float)(int)fVar25;
  }
  *(float *)((long)&local_48.x + uVar9) = fVar22;
  uVar16 = uVar16 & 0xfffffffd;
  if (uVar16 == 0) {
    fVar23 = (&local_40.x)[uVar12];
  }
  else {
    if (uVar16 != 1) goto LAB_0013ce21;
    fVar23 = fVar23 + (float)(int)(fVar24 - fVar22) + (&local_40.x)[uVar12];
  }
  (&local_38.x)[uVar12] = fVar23;
LAB_0013ce21:
  fVar22 = fVar22 / *(float *)((long)(data->FutureNode).ChildNodes + uVar12 * 4 + 0x30);
  fVar23 = 1.0;
  if (fVar22 <= 1.0) {
    fVar23 = fVar22;
  }
  fVar23 = (float)(~-(uint)(fVar22 < 0.0) & (uint)fVar23);
  (data->FutureNode).Pos = local_38;
  (data->FutureNode).Size = local_48;
  if (uVar16 == 1) {
    fVar23 = 1.0 - fVar23;
  }
  data->SplitRatio = fVar23;
  return;
}

Assistant:

static void ImGui::DockNodePreviewDockSetup(ImGuiWindow* host_window, ImGuiDockNode* host_node, ImGuiWindow* root_payload, ImGuiDockPreviewData* data, bool is_explicit_target, bool is_outer_docking)
{
    ImGuiContext& g = *GImGui;

    // There is an edge case when docking into a dockspace which only has inactive nodes.
    // In this case DockNodeTreeFindNodeByPos() will have selected a leaf node which is inactive.
    // Because the inactive leaf node doesn't have proper pos/size yet, we'll use the root node as reference.
    ImGuiDockNode* root_payload_as_host = root_payload->DockNodeAsHost;
    ImGuiDockNode* ref_node_for_rect = (host_node && !host_node->IsVisible) ? DockNodeGetRootNode(host_node) : host_node;
    if (ref_node_for_rect)
        IM_ASSERT(ref_node_for_rect->IsVisible);

    // Filter, figure out where we are allowed to dock
    ImGuiDockNodeFlags src_node_flags = root_payload_as_host ? root_payload_as_host->GetMergedFlags() : root_payload->WindowClass.DockNodeFlagsOverrideSet;
    ImGuiDockNodeFlags dst_node_flags = host_node ? host_node->GetMergedFlags() : host_window->WindowClass.DockNodeFlagsOverrideSet;
    data->IsCenterAvailable = true;
    if (is_outer_docking)
        data->IsCenterAvailable = false;
    else if (dst_node_flags & ImGuiDockNodeFlags_NoDocking)
        data->IsCenterAvailable = false;
    else if (host_node && (dst_node_flags & ImGuiDockNodeFlags_NoDockingInCentralNode) && host_node->IsCentralNode())
        data->IsCenterAvailable = false;
    else if ((!host_node || !host_node->IsEmpty()) && root_payload_as_host && root_payload_as_host->IsSplitNode() && (root_payload_as_host->OnlyNodeWithWindows == NULL)) // Is _visibly_ split?
        data->IsCenterAvailable = false;
    else if ((dst_node_flags & ImGuiDockNodeFlags_NoDockingOverMe) || (src_node_flags & ImGuiDockNodeFlags_NoDockingOverOther))
        data->IsCenterAvailable = false;

    data->IsSidesAvailable = true;
    if ((dst_node_flags & ImGuiDockNodeFlags_NoSplit) || g.IO.ConfigDockingNoSplit)
        data->IsSidesAvailable = false;
    else if (!is_outer_docking && host_node && host_node->ParentNode == NULL && host_node->IsCentralNode())
        data->IsSidesAvailable = false;
    else if ((dst_node_flags & ImGuiDockNodeFlags_NoDockingSplitMe) || (src_node_flags & ImGuiDockNodeFlags_NoDockingSplitOther))
        data->IsSidesAvailable = false;

    // Build a tentative future node (reuse same structure because it is practical. Shape will be readjusted when previewing a split)
    data->FutureNode.HasCloseButton = (host_node ? host_node->HasCloseButton : host_window->HasCloseButton) || (root_payload->HasCloseButton);
    data->FutureNode.HasWindowMenuButton = host_node ? true : ((host_window->Flags & ImGuiWindowFlags_NoCollapse) == 0);
    data->FutureNode.Pos = ref_node_for_rect ? ref_node_for_rect->Pos : host_window->Pos;
    data->FutureNode.Size = ref_node_for_rect ? ref_node_for_rect->Size : host_window->Size;

    // Calculate drop shapes geometry for allowed splitting directions
    IM_ASSERT(ImGuiDir_None == -1);
    data->SplitNode = host_node;
    data->SplitDir = ImGuiDir_None;
    data->IsSplitDirExplicit = false;
    if (!host_window->Collapsed)
        for (int dir = ImGuiDir_None; dir < ImGuiDir_COUNT; dir++)
        {
            if (dir == ImGuiDir_None && !data->IsCenterAvailable)
                continue;
            if (dir != ImGuiDir_None && !data->IsSidesAvailable)
                continue;
            if (DockNodeCalcDropRectsAndTestMousePos(data->FutureNode.Rect(), (ImGuiDir)dir, data->DropRectsDraw[dir+1], is_outer_docking, &g.IO.MousePos))
            {
                data->SplitDir = (ImGuiDir)dir;
                data->IsSplitDirExplicit = true;
            }
        }

    // When docking without holding Shift, we only allow and preview docking when hovering over a drop rect or over the title bar
    data->IsDropAllowed = (data->SplitDir != ImGuiDir_None) || (data->IsCenterAvailable);
    if (!is_explicit_target && !data->IsSplitDirExplicit && !g.IO.ConfigDockingWithShift)
        data->IsDropAllowed = false;

    // Calculate split area
    data->SplitRatio = 0.0f;
    if (data->SplitDir != ImGuiDir_None)
    {
        ImGuiDir split_dir = data->SplitDir;
        ImGuiAxis split_axis = (split_dir == ImGuiDir_Left || split_dir == ImGuiDir_Right) ? ImGuiAxis_X : ImGuiAxis_Y;
        ImVec2 pos_new, pos_old = data->FutureNode.Pos;
        ImVec2 size_new, size_old = data->FutureNode.Size;
        DockNodeCalcSplitRects(pos_old, size_old, pos_new, size_new, split_dir, root_payload->Size);

        // Calculate split ratio so we can pass it down the docking request
        float split_ratio = ImSaturate(size_new[split_axis] / data->FutureNode.Size[split_axis]);
        data->FutureNode.Pos = pos_new;
        data->FutureNode.Size = size_new;
        data->SplitRatio = (split_dir == ImGuiDir_Right || split_dir == ImGuiDir_Down) ? (1.0f - split_ratio) : (split_ratio);
    }
}